

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::NotCurrentSurfaceTest::iterate(NotCurrentSurfaceTest *this)

{
  EGLDisplay pvVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deBool dVar6;
  EGLBoolean EVar7;
  Library *egl_00;
  EGLConfig pvVar8;
  undefined4 extraout_var;
  EGLSurface pvVar9;
  EGLSurface pvVar10;
  MessageBuilder *pMVar11;
  allocator<char> local_761;
  string local_760;
  allocator<char> local_739;
  string local_738;
  ScopedLogSection local_718;
  MessageBuilder local_710;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  ScopedLogSection local_540;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  ScopedLogSection local_4c0;
  MessageBuilder local_4b8;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  ScopedLogSection local_2e8;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  ScopedLogSection local_290;
  MessageBuilder local_288;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  EGLint local_ac;
  EGLint EStack_a8;
  int bufferAge;
  EGLint damageRegion [4];
  undefined1 local_80 [8];
  CallLogWrapper wrapper;
  TestLog *log;
  UniqueSurface dummyPbuffer;
  EGLint attribList [5];
  EGLConfig config;
  Library *egl;
  int impossibleBufferAge;
  NotCurrentSurfaceTest *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  pvVar8 = getEGLConfig(egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                        SURFACETYPE_PBUFFER,false);
  dummyPbuffer.m_surface._0_4_ = 0x3057;
  dummyPbuffer.m_surface._4_4_ = 0x40;
  pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  iVar4 = (*egl_00->_vptr_Library[10])(egl_00,pvVar1,pvVar8,&dummyPbuffer.m_surface);
  eglu::UniqueSurface::UniqueSurface
            ((UniqueSurface *)&log,egl_00,pvVar1,(EGLSurface)CONCAT44(extraout_var,iVar4));
  wrapper._16_8_ =
       tcu::TestContext::getLog
                 ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx);
  eglu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)local_80,egl_00,(TestLog *)wrapper._16_8_);
  _EStack_a8 = 0xa0000000a;
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  local_ac = -0x65e4;
  eglu::CallLogWrapper::enableLogging((CallLogWrapper *)local_80,true);
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  do {
    pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
    pvVar9 = eglu::UniqueSurface::operator*((UniqueSurface *)&log);
    pvVar10 = eglu::UniqueSurface::operator*((UniqueSurface *)&log);
    (*egl_00->_vptr_Library[0x27])
              (egl_00,pvVar1,pvVar9,pvVar10,(this->super_NegativePartialUpdateTest).m_eglContext);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,"makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x122);
    dVar6 = ::deGetFalse();
    uVar2 = wrapper._16_8_;
  } while (dVar6 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Test2.1",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,
             "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE"
             ,&local_101);
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,(TestLog *)uVar2,&local_d8,&local_100);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x125);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  EVar7 = eglu::CallLogWrapper::eglQuerySurface
                    ((CallLogWrapper *)local_80,(this->super_NegativePartialUpdateTest).m_eglDisplay
                     ,(this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_ac);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x300d);
  if (local_ac != -0x65e4) {
    tcu::TestLog::operator<<
              (&local_288,(TestLog *)wrapper._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_288,
                         (char (*) [92])
                         "On failure, eglQuerySurface shouldn\'t change buffer age but buffer age has been changed to "
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ac);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_288);
    tcu::TestContext::setTestResult
              ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail, bufferAge shouldn\'t be changed");
  }
  uVar2 = wrapper._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"Test2.2",&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_2d9);
  tcu::ScopedLogSection::ScopedLogSection(&local_290,(TestLog *)uVar2,&local_2b0,&local_2d8);
  tcu::ScopedLogSection::~ScopedLogSection(&local_290);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  EVar7 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    ((CallLogWrapper *)local_80,(this->super_NegativePartialUpdateTest).m_eglDisplay
                     ,(this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_a8,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,
                     "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x135);
    dVar6 = ::deGetFalse();
    uVar2 = wrapper._16_8_;
  } while (dVar6 != 0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Test3.1",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,
             "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE"
             ,&local_331);
  tcu::ScopedLogSection::ScopedLogSection(&local_2e8,(TestLog *)uVar2,&local_308,&local_330);
  tcu::ScopedLogSection::~ScopedLogSection(&local_2e8);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    dVar5 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar5,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0x138);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  EVar7 = eglu::CallLogWrapper::eglQuerySurface
                    ((CallLogWrapper *)local_80,(this->super_NegativePartialUpdateTest).m_eglDisplay
                     ,(this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_ac);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x300d);
  if (local_ac != -0x65e4) {
    tcu::TestLog::operator<<
              (&local_4b8,(TestLog *)wrapper._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_4b8,
                         (char (*) [92])
                         "On failure, eglQuerySurface shouldn\'t change buffer age but buffer age has been changed to "
                        );
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ac);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4b8);
    tcu::TestContext::setTestResult
              ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Fail, bufferAge shouldn\'t be changed");
  }
  uVar2 = wrapper._16_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"Test3.2",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,
             "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
             ,&local_509);
  tcu::ScopedLogSection::ScopedLogSection(&local_4c0,(TestLog *)uVar2,&local_4e0,&local_508);
  tcu::ScopedLogSection::~ScopedLogSection(&local_4c0);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  EVar7 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                    ((CallLogWrapper *)local_80,(this->super_NegativePartialUpdateTest).m_eglDisplay
                     ,(this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_a8,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  pvVar1 = (this->super_NegativePartialUpdateTest).m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"EGL_KHR_surfaceless_context",&local_531);
  bVar3 = eglu::hasExtension(egl_00,pvVar1,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  if (bVar3) {
    do {
      (*egl_00->_vptr_Library[0x27])
                (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,0,0,
                 (this->super_NegativePartialUpdateTest).m_eglContext);
      dVar5 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar5,
                       "makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0x14a);
      dVar6 = ::deGetFalse();
      uVar2 = wrapper._16_8_;
    } while (dVar6 != 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"Test4.1",&local_561);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,
               "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE"
               ,&local_589);
    tcu::ScopedLogSection::ScopedLogSection(&local_540,(TestLog *)uVar2,&local_560,&local_588);
    tcu::ScopedLogSection::~ScopedLogSection(&local_540);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator(&local_589);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator(&local_561);
    do {
      (*egl_00->_vptr_Library[0x30])
                (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
                 (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
      dVar5 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar5,
                       "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                       ,0x14d);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    EVar7 = eglu::CallLogWrapper::eglQuerySurface
                      ((CallLogWrapper *)local_80,
                       (this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_ac);
    NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x300d);
    if (local_ac != -0x65e4) {
      tcu::TestLog::operator<<
                (&local_710,(TestLog *)wrapper._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_710,
                           (char (*) [92])
                           "On failure, eglQuerySurface shouldn\'t change buffer age but buffer age has been changed to "
                          );
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_ac);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_710);
      tcu::TestContext::setTestResult
                ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail, bufferAge shouldn\'t be changed");
    }
    uVar2 = wrapper._16_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"Test4.2",&local_739);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,
               "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH"
               ,&local_761);
    tcu::ScopedLogSection::ScopedLogSection(&local_718,(TestLog *)uVar2,&local_738,&local_760);
    tcu::ScopedLogSection::~ScopedLogSection(&local_718);
    std::__cxx11::string::~string((string *)&local_760);
    std::allocator<char>::~allocator(&local_761);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator(&local_739);
    EVar7 = eglu::CallLogWrapper::eglSetDamageRegionKHR
                      ((CallLogWrapper *)local_80,
                       (this->super_NegativePartialUpdateTest).m_eglDisplay,
                       (this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_a8,1);
    NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,EVar7);
    NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  }
  eglu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_80);
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&log);
  return STOP;
}

Assistant:

TestCase::IterateResult NotCurrentSurfaceTest::iterate (void)
{
	const int					impossibleBufferAge = -26084;
	const Library&				egl					= m_eglTestCtx.getLibrary();
	const EGLConfig				config				= getEGLConfig(egl, m_eglDisplay, SURFACETYPE_PBUFFER, false);
	const EGLint				attribList[]		=
	{
		EGL_WIDTH,	64,
		EGL_HEIGHT,	64,
		EGL_NONE
	};
	const eglu::UniqueSurface	dummyPbuffer		(egl, m_eglDisplay, egl.createPbufferSurface(m_eglDisplay, config, attribList));
	TestLog&					log					= m_testCtx.getLog();
	CallLogWrapper				wrapper				(egl, log);
	EGLint						damageRegion[]		= { 10, 10, 10, 10 };
	int							bufferAge			= impossibleBufferAge;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, *dummyPbuffer, *dummyPbuffer, m_eglContext));
	{
		tcu::ScopedLogSection(log, "Test2.1", "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		expectFalse(wrapper.eglQuerySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectError(EGL_BAD_SURFACE);

		if (bufferAge != impossibleBufferAge)
		{
			log << tcu::TestLog::Message << "On failure, eglQuerySurface shouldn't change buffer age but buffer age has been changed to " << bufferAge << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, bufferAge shouldn't be changed");
		}
	}
	{
		tcu::ScopedLogSection(log, "Test2.2", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
	{
		tcu::ScopedLogSection(log, "Test3.1", "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		expectFalse(wrapper.eglQuerySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectError(EGL_BAD_SURFACE);

		if (bufferAge != impossibleBufferAge)
		{
			log << tcu::TestLog::Message << "On failure, eglQuerySurface shouldn't change buffer age but buffer age has been changed to " << bufferAge << tcu::TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, bufferAge shouldn't be changed");
		}
	}
	{
		tcu::ScopedLogSection(log, "Test3.2", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
		expectError(EGL_BAD_MATCH);
	}

	if (hasExtension(egl, m_eglDisplay, "EGL_KHR_surfaceless_context"))
	{
		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, EGL_NO_SURFACE, EGL_NO_SURFACE, m_eglContext));
		{
			tcu::ScopedLogSection(log, "Test4.1", "If query buffer age on a surface that is not the current draw surface --> EGL_BAD_SURFACE");
			EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
			expectFalse(wrapper.eglQuerySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
			expectError(EGL_BAD_SURFACE);

			if (bufferAge != impossibleBufferAge)
			{
				log << tcu::TestLog::Message << "On failure, eglQuerySurface shouldn't change buffer age but buffer age has been changed to " << bufferAge << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail, bufferAge shouldn't be changed");
			}
		}
		{
			tcu::ScopedLogSection(log, "Test4.2", "If call setDamageRegion() on a surface that is not the current draw surface --> EGL_BAD_MATCH");
			expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, 1));
			expectError(EGL_BAD_MATCH);
		}
	}

	return STOP;
}